

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

SimpleHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*> * __thiscall
Memory::
AllocateArray<Memory::HeapAllocator,JsUtil::SimpleHashedEntry<Js::FunctionBody*,Js::FunctionBody*>,false>
          (Memory *this,HeapAllocator *allocator,offset_in_HeapAllocator_to_subr AllocFunc,
          size_t count)

{
  SimpleHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*> *pSVar1;
  
  pSVar1 = (SimpleHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*> *)
           new__<Memory::HeapAllocator>
                     (-(ulong)(count >> 0x3c != 0) | count << 4,(HeapAllocator *)this,
                      (offset_in_HeapAllocator_to_subr)allocator);
  return pSVar1;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}